

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_52ce5e5c fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  int iVar1;
  uint *__src;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  vector<char,std::allocator<char>> *pvVar5;
  ulong __n;
  idx_t string_position;
  ulong uVar6;
  ulong uVar7;
  void *__s2;
  ulong uVar8;
  anon_union_16_2_67f50693_for_value aVar9;
  string_t data;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  undefined8 local_78;
  char *pcStack_70;
  Vector *local_60;
  ulong local_58;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  long local_38;
  
  local_48 = b.value._8_8_;
  local_50 = b.value._0_8_;
  local_38 = a.value._8_8_;
  local_40 = a.value._0_8_;
  pvVar5 = (vector<char,std::allocator<char>> *)fun.buffer;
  local_60 = fun.result;
  lVar4 = local_38;
  if (a.value._0_4_ < 0xd) {
    lVar4 = (long)&local_40 + 4;
  }
  __s2 = local_48;
  if (b.value._0_4_ < 0xd) {
    __s2 = (void *)((long)&local_50 + 4);
  }
  local_78 = c.value._0_8_;
  pcStack_70 = c.value.pointer.ptr;
  __n = (ulong)b.value._0_4_;
  if ((c.value._0_8_ & 0xffffffff) < 0xd) {
    c.value.pointer.ptr = (char *)((long)&local_78 + 4);
  }
  uVar8 = (ulong)a.value._0_4_;
  if (*(long *)(pvVar5 + 8) != *(long *)pvVar5) {
    *(long *)(pvVar5 + 8) = *(long *)pvVar5;
  }
  local_58 = __n - 1;
  do {
    uVar7 = uVar8;
    if (local_58 < uVar8) {
      uVar6 = 0;
      uVar3 = uVar8;
      do {
        iVar1 = bcmp((void *)(lVar4 + uVar6),__s2,__n);
        uVar7 = uVar6;
        if (iVar1 == 0) break;
        uVar6 = uVar6 + 1;
        uVar3 = uVar3 - 1;
        uVar7 = uVar8;
      } while (__n <= uVar3);
    }
    uVar3 = lVar4 + uVar7;
    ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar5,*(undefined8 *)(pvVar5 + 8),lVar4);
    __src = *(uint **)pvVar5;
    if (uVar8 == uVar7) {
      uVar2 = (uint)(*(long *)(pvVar5 + 8) - (long)__src);
      if (uVar2 < 0xd) {
        local_7c = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        if (uVar2 == 0) {
          __src = (uint *)0x0;
        }
        else {
          switchD_012b9b0d::default(&uStack_84,__src,(ulong)(uVar2 & 0xf));
          __src = (uint *)CONCAT44(local_7c,uStack_80);
        }
      }
      else {
        uStack_84 = *__src;
        uVar3 = (ulong)uStack_84;
      }
      data.value.pointer.ptr = (char *)uVar3;
      data.value._0_8_ = __src;
      aVar9.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddString
                     ((StringVector *)local_60,(Vector *)CONCAT44(uStack_84,uVar2),data);
      return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
    }
    ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar5,(long)__src + (*(long *)(pvVar5 + 8) - (long)__src),c.value.pointer.ptr,
               (char *)((long)c.value.pointer.ptr + (c.value._0_8_ & 0xffffffff)));
    lVar4 = lVar4 + uVar7 + __n;
    uVar8 = uVar8 - (uVar7 + __n);
  } while( true );
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}